

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diy_fp.h
# Opt level: O0

void __thiscall
floaxie::diy_fp<float,_floaxie::diy_fp_traits<float>_>::normalize_from_ieee754
          (diy_fp<float,_floaxie::diy_fp_traits<float>_> *this)

{
  bool bVar1;
  mantissa_storage_type e_diff;
  mantissa_storage_type my_mantissa_size;
  int mantissa_bit_width;
  diy_fp<float,_floaxie::diy_fp_traits<float>_> *this_local;
  
  if (this->m_f == 0) {
    __assert_fail("m_f != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/floaxie/floaxie/diy_fp.h"
                  ,0x1f2,
                  "void floaxie::diy_fp<float>::normalize_from_ieee754() [FloatType = float, Traits = floaxie::diy_fp_traits<float>]"
                 );
  }
  while (bVar1 = nth_bit<unsigned_int>(this->m_f,0x18), ((bVar1 ^ 0xffU) & 1) != 0) {
    this->m_f = this->m_f << 1;
    this->m_e = this->m_e + -1;
  }
  this->m_f = this->m_f << 7;
  this->m_e = this->m_e + -7;
  return;
}

Assistant:

void normalize_from_ieee754() noexcept
		{
			constexpr auto mantissa_bit_width(std::numeric_limits<FloatType>::digits);

			static_assert(mantissa_bit_width >= 0, "Mantissa bit width should be positive.");

			assert(m_f != 0); // normalization of zero is undefined

			while (!nth_bit(m_f, mantissa_bit_width))
			{
				m_f <<= 1;
				m_e--;
			}

			constexpr mantissa_storage_type my_mantissa_size(bit_size<mantissa_storage_type>());
			constexpr mantissa_storage_type e_diff = my_mantissa_size - mantissa_bit_width - 1;

			m_f <<= e_diff;
			m_e -= e_diff;
		}